

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void __thiscall QPainter::fillRect(QPainter *this,QRect *r,QColor *color)

{
  undefined4 uVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  QPaintEngineEx *pQVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var2._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    fillRect();
  }
  else {
    pQVar3 = (_Var2._M_head_impl)->extended;
    if (pQVar3 == (QPaintEngineEx *)0x0) {
      QBrush::QBrush((QBrush *)local_48,color,SolidPattern);
      fillRect(this,r,(QBrush *)local_48);
      QBrush::~QBrush((QBrush *)local_48);
    }
    else {
      uVar1 = r->x1;
      uVar4 = r->y1;
      local_48._8_4_ = SUB84((double)(int)uVar4,0);
      local_48._0_8_ = (double)(int)uVar1;
      local_48._12_4_ = (int)((ulong)(double)(int)uVar4 >> 0x20);
      local_38 = (double)(((long)(r->x2).m_i - (long)(int)uVar1) + 1);
      local_30 = (double)(((long)(r->y2).m_i - (long)(int)uVar4) + 1);
      (**(code **)(*(long *)&pQVar3->super_QPaintEngine + 0x148))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::fillRect(const QRect &r, const QColor &color)
{
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::fillRect: Painter not active");
        return;
    }

    if (d->extended) {
        d->extended->fillRect(r, color);
        return;
    }

    fillRect(r, QBrush(color));
}